

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall cmConfigureLog::~cmConfigureLog(cmConfigureLog *this)

{
  if (this->Opened == true) {
    EndObject(this);
    std::operator<<(&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"...\n");
  }
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&this->Encoder);
  std::ofstream::~ofstream(&this->Stream);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->LogVersions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmConfigureLog::~cmConfigureLog()
{
  if (this->Opened) {
    this->EndObject();
    this->Stream << "...\n";
  }
}